

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriter.cpp
# Opt level: O0

void __thiscall adios2::core::engine::SscWriter::PerformPuts(SscWriter *this)

{
  int iVar1;
  element_type *peVar2;
  ScopedTimer __var275;
  void *in_stack_ffffffffffffffc8;
  ScopedTimer *in_stack_ffffffffffffffd0;
  
  if (PerformPuts()::__var75 == '\0') {
    iVar1 = __cxa_guard_acquire(&PerformPuts()::__var75);
    if (iVar1 != 0) {
      in_stack_ffffffffffffffd0 =
           (ScopedTimer *)
           ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/engine/ssc/SscWriter.cpp"
                               ,"virtual void adios2::core::engine::SscWriter::PerformPuts()",0x4b);
      PerformPuts::__var75 = (void *)ps_timer_create_(in_stack_ffffffffffffffd0);
      in_stack_ffffffffffffffc8 = PerformPuts::__var75;
      __cxa_guard_release(&PerformPuts()::__var75);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  peVar2 = std::
           __shared_ptr_access<adios2::core::engine::ssc::SscWriterBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<adios2::core::engine::ssc::SscWriterBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1c81f5);
  (*peVar2->_vptr_SscWriterBase[4])();
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void SscWriter::PerformPuts()
{
    PERFSTUBS_SCOPED_TIMER_FUNC();
    m_EngineInstance->PerformPuts();
}